

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O2

ref<immutable::rrb<int,_false,_6>_> immutable::rrb_create<int,false,6>(void)

{
  undefined8 *puVar1;
  rrb<int,_false,_6> *in_RDI;
  ref<immutable::rrb_details::leaf_node<int,_false>_> local_20;
  
  puVar1 = (undefined8 *)malloc(0x28);
  *puVar1 = 0;
  *(undefined4 *)(puVar1 + 1) = 0;
  puVar1[2] = 0;
  puVar1[3] = 0;
  local_20.ptr = rrb_details::create_empty_leaf<int,false>();
  if (local_20.ptr != (leaf_node<int,_false> *)0x0) {
    (local_20.ptr)->_ref_count = 1;
  }
  ref<immutable::rrb_details::leaf_node<int,_false>_>::operator=
            ((ref<immutable::rrb_details::leaf_node<int,_false>_> *)(puVar1 + 2),&local_20);
  rrb_details::release<int>(local_20.ptr);
  *(undefined8 **)in_RDI = puVar1;
  *(undefined4 *)(puVar1 + 4) = 1;
  return (ref<immutable::rrb<int,_false,_6>_>)in_RDI;
}

Assistant:

inline ref<rrb<T, atomic_ref_counting, N>> rrb_create()
    {
    rrb<T, atomic_ref_counting, N>* empty = (rrb<T, atomic_ref_counting, N>*)malloc(sizeof(rrb<T, atomic_ref_counting, N>));
    empty->cnt = 0;
    empty->shift = 0;
    empty->root.ptr = nullptr;
    empty->tail.ptr = nullptr;
    empty->tail_len = 0;
    empty->tail = rrb_details::create_empty_leaf<T, atomic_ref_counting>();
    return ref<rrb<T, atomic_ref_counting, N>>(empty);
    }